

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Triangle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Triangle *this,Ray *ray,
          Float tMax)

{
  ulong uVar1;
  int triIndex;
  TriangleMesh *mesh;
  int *piVar2;
  Point3f *pPVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  optional<pbrt::TriangleIntersection> triIsect;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  SurfaceInteraction intr;
  optional<pbrt::TriangleIntersection> local_174;
  Tuple3<pbrt::Vector3,_float> local_160;
  Tuple3<pbrt::Point3,_float> local_150;
  Tuple3<pbrt::Point3,_float> local_140;
  Tuple3<pbrt::Point3,_float> local_130;
  SurfaceInteraction local_120;
  
  lVar4 = allMeshes;
  *(long *)(in_FS_OFFSET + -0x490) = *(long *)(in_FS_OFFSET + -0x490) + 1;
  triIndex = this->triIndex;
  lVar5 = (long)triIndex;
  mesh = *(TriangleMesh **)(*(long *)(lVar4 + 8) + (long)this->meshIndex * 8);
  piVar2 = mesh->vertexIndices;
  pPVar3 = mesh->p;
  local_130.z = pPVar3[piVar2[lVar5 * 3]].super_Tuple3<pbrt::Point3,_float>.z;
  local_130.x = pPVar3[piVar2[lVar5 * 3]].super_Tuple3<pbrt::Point3,_float>.x;
  local_130.y = pPVar3[piVar2[lVar5 * 3]].super_Tuple3<pbrt::Point3,_float>.y;
  local_140.z = pPVar3[piVar2[lVar5 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  local_140.x = pPVar3[piVar2[lVar5 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  local_140.y = pPVar3[piVar2[lVar5 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  local_150.z = pPVar3[piVar2[lVar5 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  local_150.x = pPVar3[piVar2[lVar5 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  local_150.y = pPVar3[piVar2[lVar5 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  IntersectTriangle(&local_174,ray,tMax,(Point3f *)&local_130,(Point3f *)&local_140,
                    (Point3f *)&local_150);
  if (local_174.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    uVar1._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar1._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar6._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar6._8_4_ = 0x80000000;
    auVar6._12_4_ = 0x80000000;
    local_160.z = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    local_160._0_8_ = vmovlps_avx(auVar6);
    InteractionFromIntersection
              (&local_120,mesh,triIndex,(TriangleIntersection *)&local_174,ray->time,
               (Vector3f *)&local_160);
    *(long *)(in_FS_OFFSET + -0x488) = *(long *)(in_FS_OFFSET + -0x488) + 1;
    if (local_174.set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f54c6d);
    }
    __return_storage_ptr__->set = true;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) =
         local_120.super_Interaction.mediumInterface;
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) =
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         local_120.super_Interaction._24_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
         local_120.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
         local_120.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         local_120.super_Interaction._48_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
         local_120.super_Interaction._56_8_;
    ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      *)((long)&__return_storage_ptr__->optionalValue + 0x48))->bits =
         (uintptr_t)
         local_120.super_Interaction.medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
         local_120.dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_120._88_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         local_120.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
         local_120.dndu.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_120._112_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
         local_120.dndv.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_120.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_120.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_120.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_120.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
         local_120.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
         local_120.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_120.shading._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
         local_120.shading.dndu.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
         local_120.shading.dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_120._184_8_;
    ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      *)((long)&__return_storage_ptr__->optionalValue + 0xc0))->bits =
         (uintptr_t)
         local_120.material.
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      *)((long)&__return_storage_ptr__->optionalValue + 200))->bits =
         (uintptr_t)
         local_120.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_120._240_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
         local_120.dpdx.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_120._216_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
         local_120.dpdy.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_120._232_8_;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
         local_174.optionalValue._12_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> Triangle::Intersect(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> triIsect =
        IntersectTriangle(ray, tMax, p0, p1, p2);
    if (!triIsect)
        return {};

    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, triIndex, *triIsect, ray.time, -ray.d);
#ifndef PBRT_IS_GPU_CODE
    ++nTriHits;
#endif
    return ShapeIntersection{intr, triIsect->t};
}